

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

ZIPentry * zip_follow_symlink(PHYSFS_Io *io,ZIPinfo *info,char *path)

{
  int iVar1;
  ZIPentry *local_28;
  ZIPentry *entry;
  char *path_local;
  ZIPinfo *info_local;
  PHYSFS_Io *io_local;
  
  zip_expand_symlink_path(path);
  local_28 = zip_find_entry(info,path);
  if (local_28 != (ZIPentry *)0x0) {
    iVar1 = zip_resolve(io,info,local_28);
    if (iVar1 == 0) {
      local_28 = (ZIPentry *)0x0;
    }
    else if (local_28->symlink != (_ZIPentry *)0x0) {
      local_28 = local_28->symlink;
    }
  }
  return local_28;
}

Assistant:

static ZIPentry *zip_follow_symlink(PHYSFS_Io *io, ZIPinfo *info, char *path)
{
    ZIPentry *entry;

    zip_expand_symlink_path(path);
    entry = zip_find_entry(info, path);
    if (entry != NULL)
    {
        if (!zip_resolve(io, info, entry))  /* recursive! */
            entry = NULL;
        else
        {
            if (entry->symlink != NULL)
                entry = entry->symlink;
        } /* else */
    } /* if */

    return entry;
}